

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_swift_generator.cc
# Opt level: O0

void __thiscall
t_swift_generator::generate_swift_struct_init
          (t_swift_generator *this,ostream *out,t_struct *tstruct,bool all,bool is_private)

{
  bool bVar1;
  e_req eVar2;
  ostream *poVar3;
  t_type *ttype;
  reference pptVar4;
  string *psVar5;
  byte local_20a;
  char *local_1b0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  byte local_d9;
  const_iterator cStack_d8;
  bool should_set;
  t_field **local_d0;
  string local_c8;
  string local_a8;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_88;
  t_field **local_80;
  byte local_71;
  const_iterator cStack_70;
  bool first;
  const_iterator m_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *members;
  allocator local_49;
  string local_48 [8];
  string visibility;
  bool is_private_local;
  bool all_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_swift_generator *this_local;
  
  if (is_private) {
    local_1b0 = "fileprivate";
    if ((this->gen_cocoa_ & 1U) != 0) {
      local_1b0 = "private";
    }
  }
  else {
    local_1b0 = "public";
  }
  visibility.field_2._M_local_buf[0xe] = is_private;
  visibility.field_2._M_local_buf[0xf] = all;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,local_1b0,&local_49);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,local_48);
  std::operator<<(poVar3," init(");
  m_iter._M_current = (t_field **)t_struct::get_members(tstruct);
  __gnu_cxx::
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
  __normal_iterator(&stack0xffffffffffffff90);
  local_71 = 1;
  local_80 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  cStack_70 = (const_iterator)local_80;
  while( true ) {
    local_88._M_current =
         (t_field **)std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffff90,&local_88);
    if (!bVar1) break;
    if ((visibility.field_2._M_local_buf[0xf] & 1U) == 0) {
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff90);
      bVar1 = field_is_optional(this,*pptVar4);
      if (!bVar1) goto LAB_0047d5a0;
    }
    else {
LAB_0047d5a0:
      if ((local_71 & 1) == 0) {
        std::operator<<(out,", ");
      }
      else {
        local_71 = 0;
      }
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff90);
      psVar5 = t_field::get_name_abi_cxx11_(*pptVar4);
      poVar3 = std::operator<<(out,(string *)psVar5);
      poVar3 = std::operator<<(poVar3,": ");
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff90);
      ttype = t_field::get_type(*pptVar4);
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff90);
      bVar1 = field_is_optional(this,*pptVar4);
      type_name_abi_cxx11_(&local_c8,this,ttype,bVar1,false);
      maybe_escape_identifier(&local_a8,this,&local_c8);
      std::operator<<(poVar3,(string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&stack0xffffffffffffff90);
  }
  std::operator<<(out,")");
  block_open(this,out);
  local_d0 = (t_field **)
             std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(m_iter._M_current);
  cStack_70 = (const_iterator)local_d0;
  do {
    cStack_d8 = std::vector<t_field_*,_std::allocator<t_field_*>_>::end(m_iter._M_current);
    bVar1 = __gnu_cxx::operator!=(&stack0xffffffffffffff90,&stack0xffffffffffffff28);
    if (!bVar1) {
      block_close(this,out,true);
      std::operator<<(out,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string(local_48);
      return;
    }
    if ((this->gen_cocoa_ & 1U) == 0) {
      local_d9 = visibility.field_2._M_local_buf[0xf] & 1;
      local_20a = 1;
      if (local_d9 == 0) {
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&stack0xffffffffffffff90);
        bVar1 = field_is_optional(this,*pptVar4);
        local_20a = bVar1 ^ 0xff;
      }
      local_d9 = local_20a & 1;
      if (local_d9 != 0) {
        t_generator::indent_abi_cxx11_(&local_100,(t_generator *)this);
        poVar3 = std::operator<<(out,(string *)&local_100);
        poVar3 = std::operator<<(poVar3,"self.");
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&stack0xffffffffffffff90);
        psVar5 = t_field::get_name_abi_cxx11_(*pptVar4);
        maybe_escape_identifier(&local_120,this,psVar5);
        poVar3 = std::operator<<(poVar3,(string *)&local_120);
        poVar3 = std::operator<<(poVar3," = ");
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&stack0xffffffffffffff90);
        psVar5 = t_field::get_name_abi_cxx11_(*pptVar4);
        maybe_escape_identifier(&local_140,this,psVar5);
        poVar3 = std::operator<<(poVar3,(string *)&local_140);
        std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_140);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_100);
      }
    }
    else {
      if ((visibility.field_2._M_local_buf[0xf] & 1U) == 0) {
        pptVar4 = __gnu_cxx::
                  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                  ::operator*(&stack0xffffffffffffff90);
        eVar2 = t_field::get_req(*pptVar4);
        if (eVar2 != T_REQUIRED) {
          pptVar4 = __gnu_cxx::
                    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                    ::operator*(&stack0xffffffffffffff90);
          eVar2 = t_field::get_req(*pptVar4);
          if (eVar2 != T_OPT_IN_REQ_OUT) goto LAB_0047dbbc;
        }
      }
      t_generator::indent_abi_cxx11_(&local_160,(t_generator *)this);
      poVar3 = std::operator<<(out,(string *)&local_160);
      poVar3 = std::operator<<(poVar3,"self.");
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff90);
      psVar5 = t_field::get_name_abi_cxx11_(*pptVar4);
      maybe_escape_identifier(&local_180,this,psVar5);
      poVar3 = std::operator<<(poVar3,(string *)&local_180);
      poVar3 = std::operator<<(poVar3," = ");
      pptVar4 = __gnu_cxx::
                __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                ::operator*(&stack0xffffffffffffff90);
      psVar5 = t_field::get_name_abi_cxx11_(*pptVar4);
      maybe_escape_identifier(&local_1a0,this,psVar5);
      poVar3 = std::operator<<(poVar3,(string *)&local_1a0);
      std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_160);
    }
LAB_0047dbbc:
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    operator++(&stack0xffffffffffffff90);
  } while( true );
}

Assistant:

void t_swift_generator::generate_swift_struct_init(ostream& out,
                                                   t_struct* tstruct,
                                                   bool all,
                                                   bool is_private) {

  string visibility = is_private ? (gen_cocoa_ ? "private" : "fileprivate") : "public";

  indent(out) << visibility << " init(";

  const vector<t_field*>& members = tstruct->get_members();
  vector<t_field*>::const_iterator m_iter;

  bool first=true;
  for (m_iter = members.begin(); m_iter != members.end();) {
    if (all || !field_is_optional(*m_iter)) {
      if (first) {
        first = false;
      }
      else {
        out << ", ";
      }
      out << (*m_iter)->get_name() << ": "
          << maybe_escape_identifier(type_name((*m_iter)->get_type(), field_is_optional(*m_iter)));
    }
    ++m_iter;
  }
  out << ")";

  block_open(out);

  for (m_iter = members.begin(); m_iter != members.end(); ++m_iter) {
    if (!gen_cocoa_) {
      bool should_set = all;
      should_set = should_set || !field_is_optional((*m_iter));
      if (should_set) {
        out << indent() << "self." << maybe_escape_identifier((*m_iter)->get_name()) << " = "
            << maybe_escape_identifier((*m_iter)->get_name()) << endl;
      }
    } else {
      /** legacy Swift2/Cocoa */
      if (all || (*m_iter)->get_req() == t_field::T_REQUIRED || (*m_iter)->get_req() == t_field::T_OPT_IN_REQ_OUT) {
        out << indent() << "self." << maybe_escape_identifier((*m_iter)->get_name()) << " = "
            << maybe_escape_identifier((*m_iter)->get_name()) << endl;
      }
    }
  }

  block_close(out);

  out << endl;
}